

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_dophase_done(connectdata *conn,_Bool connected)

{
  void *pvVar1;
  CURLcode CVar2;
  undefined7 in_register_00000031;
  int completed;
  int local_24;
  
  pvVar1 = (conn->data->req).protop;
  if (((int)CONCAT71(in_register_00000031,connected) != 0) &&
     (CVar2 = ftp_do_more(conn,&local_24), CVar2 != CURLE_OK)) {
    if (conn->sock[1] == -1) {
      return CVar2;
    }
    Curl_closesocket(conn,conn->sock[1]);
    conn->sock[1] = -1;
    return CVar2;
  }
  if (*(int *)((long)pvVar1 + 0x18) == 0) {
    if (!connected) {
      (conn->bits).do_more = true;
    }
  }
  else {
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
  }
  (conn->proto).ftpc.ctl_valid = true;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_dophase_done(struct connectdata *conn,
                                 bool connected)
{
  struct FTP *ftp = conn->data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(conn, &completed);

    if(result) {
      if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
        /* close the second socket if it was created already */
        Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
        conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
      }
      return result;
    }
  }

  if(ftp->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
  else if(!connected)
    /* since we didn't connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}